

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O2

void __thiscall KDIS::UTILS::DIS_Logger_Playback::loadFromFile(DIS_Logger_Playback *this)

{
  ushort uVar1;
  char cVar2;
  size_type sVar3;
  KException *this_00;
  allocator<char> local_71;
  Log l;
  
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&l,"loadFromFile",&local_71);
    KException::KException(this_00,&l.sStamp,6);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  l.sStamp._M_dataplus._M_p = (pointer)&l.sStamp.field_2;
  l.sStamp._M_string_length = 0;
  l.sStamp.field_2._M_local_buf[0] = '\0';
  l.sData._M_dataplus._M_p = (pointer)&l.sData.field_2;
  l.sData._M_string_length = 0;
  l.sData.field_2._M_local_buf[0] = '\0';
  do {
    do {
      if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) goto LAB_002ac5a9;
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)this,(string *)&l);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)this,(string *)&l.sData);
      std::
      deque<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
      ::push_back(&(this->m_qLog).c,&l);
      uVar1 = this->m_ui16PreLoadLines;
    } while ((ulong)uVar1 == 0);
    sVar3 = std::
            deque<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
            ::size(&(this->m_qLog).c);
  } while (uVar1 < sVar3);
LAB_002ac5a9:
  Log::~Log(&l);
  return;
}

Assistant:

void DIS_Logger_Playback::loadFromFile() noexcept(false)
{
    if( m_File.is_open() == false )throw KException( __FUNCTION__, FILE_NOT_OPEN );

    Log l;

    while( m_File.eof() == false )
    {
        getline( m_File, l.sStamp );
        getline( m_File, l.sData );

        m_qLog.push( l );

        if( m_ui16PreLoadLines != 0 )
        {
            if( m_ui16PreLoadLines >= m_qLog.size() )break;
        }
    }
}